

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O3

void __thiscall EntryKey::dump(EntryKey *this)

{
  ostream *poVar1;
  long *plVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  
  *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
       *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) &
       0xffffffb5 | 8;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Flags: 0x",9);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Name index: 0x",0xe);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Ext index: 0x",0xd);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Link index: 0x",0xe);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Is directory: ",0xe);
  pcVar5 = "true";
  pcVar4 = "true";
  uVar3 = this->m_flags & 1;
  if (uVar3 == 0) {
    pcVar4 = "false";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar4,(ulong)uVar3 ^ 5);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Is file: ",9);
  bVar6 = (this->m_flags & 2) == 0;
  if (bVar6) {
    pcVar5 = "false";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar5,(ulong)bVar6 | 4);
  std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
  std::ostream::put((char)poVar1);
  plVar2 = (long *)std::ostream::flush();
  *(uint *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x18) =
       *(uint *)((long)plVar2 + *(long *)(*plVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  return;
}

Assistant:

void EntryKey::dump() const
{
	std::cout
		<< std::hex
		<< "Flags: 0x" << flags() << std::endl
		<< "Name index: 0x" << nameIndex() << std::endl
		<< "Ext index: 0x" << extIndex() << std::endl
		<< "Link index: 0x" << linkIndex() << std::endl
		<< "Is directory: " << (isDirectory() ? "true" : "false") << std::endl
		<< "Is file: " << (isFile() ? "true" : "false") << std::endl
		<< std::dec << std::endl;
}